

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUTF8Transcoder.hpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLUTF8Transcoder::checkTrailingBytes
          (XMLUTF8Transcoder *this,XMLByte toCheck,uint trailingBytes,uint position)

{
  UTFDataFormatException *this_00;
  MemoryManager *memoryManager;
  XMLByte local_22 [3];
  undefined1 local_1f;
  char local_1e [2];
  char cStack_1c;
  char byte [2];
  char pos [2];
  char len [2];
  uint position_local;
  uint trailingBytes_local;
  XMLByte toCheck_local;
  XMLUTF8Transcoder *this_local;
  
  if ((toCheck & 0xc0) != 0x80) {
    pos[0] = (char)trailingBytes;
    local_1e[0] = pos[0] + '1';
    local_1e[1] = 0;
    cStack_1c = (char)position;
    local_22[2] = cStack_1c + '1';
    local_1f = 0;
    local_22[1] = 0;
    local_22[0] = toCheck;
    _cStack_1c = position;
    this_00 = (UTFDataFormatException *)__cxa_allocate_exception(0x30);
    memoryManager = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
    UTFDataFormatException::UTFDataFormatException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUTF8Transcoder.hpp"
               ,0x6f,UTF8_FormatError,(char *)(local_22 + 2),(char *)local_22,local_1e,(char *)0x0,
               memoryManager);
    __cxa_throw(this_00,&UTFDataFormatException::typeinfo,
                UTFDataFormatException::~UTFDataFormatException);
  }
  return;
}

Assistant:

inline 
void XMLUTF8Transcoder::checkTrailingBytes(const XMLByte      toCheck
                                          , const unsigned int trailingBytes
                                          , const unsigned int position) const
{

    if((toCheck & 0xC0) != 0x80) 
    {
        char len[2]  = {(char)(trailingBytes+0x31), 0};
        char pos[2]  = {(char)(position+0x31), 0};
        char byte[2] = {(char)toCheck,0};
        ThrowXMLwithMemMgr3(UTFDataFormatException, XMLExcepts::UTF8_FormatError, pos, byte, len, getMemoryManager());
    }

}